

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btorsim.cpp
# Opt level: O1

int32_t main(int32_t argc,char **argv)

{
  Btor2SortTag BVar1;
  int iVar2;
  int32_t iVar3;
  uint uVar4;
  BtorSimVCDWriter *pBVar5;
  undefined8 uVar6;
  Btor2Line *pBVar7;
  value_type pBVar8;
  undefined8 extraout_RAX;
  int64_t iVar9;
  pointer ppBVar10;
  long lVar11;
  char *pcVar12;
  iterator __position;
  ulong uVar13;
  char *pcVar14;
  vector<Btor2Line_*,_std::allocator<Btor2Line_*>_> *this;
  int iVar15;
  ulong uVar16;
  long lVar17;
  bool bVar18;
  bool bVar19;
  int32_t r;
  int32_t s;
  int32_t ch;
  int64_t fake_justice;
  int64_t fake_bad;
  int32_t local_90;
  uint local_8c;
  Btor2Line *local_88;
  char *local_80;
  ulong local_78;
  ulong local_70 [2];
  _Rb_tree<long,_std::pair<const_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  
  local_70[0] = 0xffffffffffffffff;
  local_78 = 0xffffffffffffffff;
  local_90 = -1;
  local_8c = 0xffffffff;
  if (argc < 2) {
    local_80 = (char *)0x0;
  }
  else {
    iVar15 = 1;
    local_80 = (char *)0x0;
    do {
      pcVar12 = argv[iVar15];
      iVar2 = strcmp(pcVar12,"-h");
      if (iVar2 == 0) {
        fputs("usage: btorsim [ <option> ... ] [ <btor> [ <witness> ] ]\n\nwhere <option> is one of the following\n\n  -h        print this command line option summary\n  -c        check only <witness> and do not print trace\n  -v        increase verbosity level (multiple times if necessary)\n  -r <n>    generate <n> random transitions (default 20)\n  -s <s>    random seed (default \'0\')\n\n  -b <n>    fake simulation to satisfy bad state property \'b<n>\'\n  -j <n>    fake simulation to satisfy justice property \'j<n>\'\n\n  --states                 print all states\n  --vcd <file>             write VCD trace to <file>\n  --hierarchical-symbols   interpret \'.\' in symbol names as hierarchical\n                           module path in VCD\n  --info <file>            read additional information for clocks and\n                           top module name from <file>\n\nand \'<btor>\' is sequential model in \'BTOR\' format\nand \'<witness>\' a trace in \'BTOR\' witness format.\n\nThe simulator either checks a given witness (checking mode) or\nrandomly generates inputs (random mode). If no BTOR model path is\nspecified then it is read from \'<stdin>\'.  The simulator only uses\nchecking mode if both the BTOR model and a witness file are specified.\n"
              ,_stdout);
        exit(0);
      }
      iVar2 = strcmp(pcVar12,"-c");
      if (iVar2 == 0) {
        print_trace = '\x01';
        pcVar14 = model_path;
      }
      else {
        iVar2 = strcmp(pcVar12,"-v");
        if (iVar2 == 0) {
          verbosity = verbosity + 1;
          pcVar14 = model_path;
        }
        else {
          iVar2 = strcmp(pcVar12,"-r");
          if (iVar2 == 0) {
            iVar15 = iVar15 + 1;
            if (iVar15 == argc) {
              die("argument to \'-r\' missing");
            }
            pcVar12 = argv[iVar15];
            iVar3 = parse_int(pcVar12,&local_90);
            pcVar14 = model_path;
            if (iVar3 == 0) {
              pcVar14 = "invalid number in \'-r %s\'";
LAB_0010edd9:
              die(pcVar14,pcVar12);
              pcVar14 = model_path;
            }
          }
          else {
            iVar2 = strcmp(pcVar12,"-s");
            if (iVar2 == 0) {
              iVar15 = iVar15 + 1;
              if (iVar15 == argc) {
                die("argument to \'-s\' missing");
              }
              pcVar12 = argv[iVar15];
              iVar3 = parse_int(pcVar12,(int32_t *)&local_8c);
              pcVar14 = model_path;
              if (iVar3 == 0) {
                pcVar14 = "invalid number in \'-s %s\'";
                goto LAB_0010edd9;
              }
            }
            else {
              iVar2 = strcmp(pcVar12,"-b");
              if (iVar2 == 0) {
                iVar15 = iVar15 + 1;
                if (iVar15 == argc) {
                  die("argument to \'-b\' missing");
                }
                pcVar12 = argv[iVar15];
                iVar3 = parse_long(pcVar12,(int64_t *)local_70);
                pcVar14 = model_path;
                if (iVar3 == 0) {
                  pcVar14 = "invalid number in \'-b %s\'";
                  goto LAB_0010edd9;
                }
              }
              else {
                iVar2 = strcmp(pcVar12,"-j");
                if (iVar2 == 0) {
                  iVar15 = iVar15 + 1;
                  if (iVar15 == argc) {
                    die("argument to \'-j\' missing");
                  }
                  pcVar12 = argv[iVar15];
                  iVar3 = parse_long(pcVar12,(int64_t *)&local_78);
                  pcVar14 = model_path;
                  if (iVar3 == 0) {
                    pcVar14 = "invalid number in \'-j %s\'";
                    goto LAB_0010edd9;
                  }
                }
                else {
                  iVar2 = strcmp(pcVar12,"--states");
                  if (iVar2 == 0) {
                    print_states = 1;
                    pcVar14 = model_path;
                  }
                  else {
                    iVar2 = strcmp(pcVar12,"--vcd");
                    if (iVar2 == 0) {
                      dump_vcd = '\x01';
                      iVar15 = iVar15 + 1;
                      if (iVar15 == argc) {
                        die("argument to \'--vcd\' missing");
                      }
                      vcd_path = argv[iVar15];
                      pcVar14 = model_path;
                    }
                    else {
                      iVar2 = strcmp(pcVar12,"--hierarchical-symbols");
                      if (iVar2 == 0) {
                        symbol_fmt = 1;
                        pcVar14 = model_path;
                      }
                      else {
                        iVar2 = strcmp(pcVar12,"--info");
                        if (iVar2 == 0) {
                          iVar15 = iVar15 + 1;
                          if (iVar15 == argc) {
                            die("argument to \'--info\' missing");
                          }
                          local_80 = argv[iVar15];
                          pcVar14 = model_path;
                        }
                        else {
                          if (*pcVar12 == '-') {
                            pcVar14 = "invalid command line option \'%s\' (try \'-h\')";
                            goto LAB_0010edd9;
                          }
                          if (witness_path == (char *)0x0) {
                            pcVar14 = pcVar12;
                            if (model_path != (char *)0x0) {
                              witness_path = pcVar12;
                              pcVar14 = model_path;
                            }
                          }
                          else {
                            die("too many file arguments \'%s\', \'%s\', and \'%s\'",model_path,
                                witness_path,pcVar12);
                            pcVar14 = model_path;
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      model_path = pcVar14;
      iVar15 = iVar15 + 1;
    } while (iVar15 < argc);
  }
  if (model_path == (char *)0x0) {
    model_path = "<stdin>";
    model_file = _stdin;
  }
  else {
    model_file = (FILE *)fopen(model_path,"r");
    if ((FILE *)model_file == (FILE *)0x0) {
      die("failed to open BTOR model file \'%s\' for reading",model_path);
    }
    close_model_file = '\x01';
  }
  if (witness_path != (char *)0x0) {
    witness_file = (FILE *)fopen(witness_path,"r");
    if ((FILE *)witness_file == (FILE *)0x0) {
      die("failed to open witness file \'%s\' for reading",witness_path);
    }
    close_witness_file = '\x01';
  }
  bVar18 = model_path != (char *)0x0;
  bVar19 = witness_path != (char *)0x0;
  pcVar12 = "checking mode: both model and witness specified";
  if (!bVar19 || !bVar18) {
    pcVar12 = "random mode: witness not specified";
  }
  msg(1,pcVar12);
  if (bVar19 && bVar18) {
    if (-1 < local_90) {
      die("number of random test vectors specified in checking mode");
    }
    if (-1 < (int)local_8c) {
      die("random seed specified in checking mode");
    }
    if (-1 < (long)local_70[0]) {
      die("can not fake bad state property in checking mode");
    }
    if (-1 < (long)local_78) {
      die("can not fake justice property in checking mode");
    }
  }
  if (dump_vcd == '\x01') {
    pBVar5 = (BtorSimVCDWriter *)operator_new(0x2f8);
    BtorSimVCDWriter::BtorSimVCDWriter(pBVar5,vcd_path,false,(bool)symbol_fmt);
    vcd_writer = pBVar5;
    if (local_80 != (char *)0x0) {
      BtorSimVCDWriter::read_info_file_abi_cxx11_
                ((map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&local_60,pBVar5,local_80);
      std::
      _Rb_tree<long,_std::pair<const_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::clear(&extra_constraints_abi_cxx11_._M_t);
      if (local_60._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
        extra_constraints_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
             local_60._M_impl.super__Rb_tree_header._M_header._M_color;
        extra_constraints_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
        extra_constraints_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             local_60._M_impl.super__Rb_tree_header._M_header._M_left;
        extra_constraints_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             local_60._M_impl.super__Rb_tree_header._M_header._M_right;
        (local_60._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
             &extra_constraints_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header;
        extra_constraints_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_node_count =
             local_60._M_impl.super__Rb_tree_header._M_node_count;
        local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_60._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)((long)&local_60 + 8U)
        ;
        local_60._M_impl.super__Rb_tree_header._M_header._M_right =
             (_Base_ptr)((long)&local_60 + 8U);
      }
      std::
      _Rb_tree<long,_std::pair<const_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_60);
    }
  }
  msg(1,"reading BTOR model from \'%s\'",model_path);
  model = (Btor2Parser *)btor2parser_new();
  iVar15 = btor2parser_read_lines(model,model_file);
  pcVar12 = model_path;
  if (iVar15 == 0) {
    uVar6 = btor2parser_error(model);
    die("parse error in \'%s\' at %s",pcVar12,uVar6);
  }
  num_format_lines = btor2parser_max_id(model);
  local_60._M_impl._0_8_ = (value_type)0x0;
  std::vector<Btor2Line_*,_std::allocator<Btor2Line_*>_>::resize
            (&inits,num_format_lines,(value_type *)&local_60);
  local_60._M_impl._0_8_ = (value_type)0x0;
  std::vector<Btor2Line_*,_std::allocator<Btor2Line_*>_>::resize
            (&nexts,num_format_lines,(value_type *)&local_60);
  local_60._M_impl._0_16_ = btor2parser_iter_init(model);
  pBVar7 = (Btor2Line *)btor2parser_iter_next(&local_60);
  if (pBVar7 != (Btor2Line *)0x0) {
    do {
      local_88 = pBVar7;
      switch(pBVar7->tag) {
      case BTOR2_TAG_add:
      case BTOR2_TAG_and:
      case BTOR2_TAG_concat:
      case BTOR2_TAG_const:
      case BTOR2_TAG_constd:
      case BTOR2_TAG_consth:
      case BTOR2_TAG_dec:
      case BTOR2_TAG_eq:
      case BTOR2_TAG_iff:
      case BTOR2_TAG_implies:
      case BTOR2_TAG_inc:
      case BTOR2_TAG_ite:
      case BTOR2_TAG_mul:
      case BTOR2_TAG_nand:
      case BTOR2_TAG_neq:
      case BTOR2_TAG_neg:
      case BTOR2_TAG_nor:
      case BTOR2_TAG_not:
      case BTOR2_TAG_one:
      case BTOR2_TAG_ones:
      case BTOR2_TAG_or:
      case BTOR2_TAG_output:
      case BTOR2_TAG_read:
      case BTOR2_TAG_redand:
      case BTOR2_TAG_redor:
      case BTOR2_TAG_redxor:
      case BTOR2_TAG_rol:
      case BTOR2_TAG_ror:
      case BTOR2_TAG_sdiv:
      case BTOR2_TAG_sext:
      case BTOR2_TAG_sgt:
      case BTOR2_TAG_sgte:
      case BTOR2_TAG_slice:
      case BTOR2_TAG_sll:
      case BTOR2_TAG_slt:
      case BTOR2_TAG_slte:
      case BTOR2_TAG_smod:
      case BTOR2_TAG_sra:
      case BTOR2_TAG_srem:
      case BTOR2_TAG_srl:
      case BTOR2_TAG_sub:
      case BTOR2_TAG_udiv:
      case BTOR2_TAG_uext:
      case BTOR2_TAG_ugt:
      case BTOR2_TAG_ugte:
      case BTOR2_TAG_ult:
      case BTOR2_TAG_ulte:
      case BTOR2_TAG_urem:
      case BTOR2_TAG_write:
      case BTOR2_TAG_xnor:
      case BTOR2_TAG_xor:
      case BTOR2_TAG_zero:
        break;
      case BTOR2_TAG_bad:
        msg(2,"bad %ld at line %ld",
            (long)bads.super__Vector_base<Btor2Line_*,_std::allocator<Btor2Line_*>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)bads.super__Vector_base<Btor2Line_*,_std::allocator<Btor2Line_*>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3,pBVar7->lineno);
        if (bads.super__Vector_base<Btor2Line_*,_std::allocator<Btor2Line_*>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            bads.super__Vector_base<Btor2Line_*,_std::allocator<Btor2Line_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<Btor2Line*,std::allocator<Btor2Line*>>::_M_realloc_insert<Btor2Line*const&>
                    ((vector<Btor2Line*,std::allocator<Btor2Line*>> *)&bads,
                     (iterator)
                     bads.super__Vector_base<Btor2Line_*,_std::allocator<Btor2Line_*>_>._M_impl.
                     super__Vector_impl_data._M_finish,&local_88);
        }
        else {
          *bads.super__Vector_base<Btor2Line_*,_std::allocator<Btor2Line_*>_>._M_impl.
           super__Vector_impl_data._M_finish = local_88;
          bads.super__Vector_base<Btor2Line_*,_std::allocator<Btor2Line_*>_>._M_impl.
          super__Vector_impl_data._M_finish =
               bads.super__Vector_base<Btor2Line_*,_std::allocator<Btor2Line_*>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        local_70[1] = 0xffffffffffffffff;
        if (reached_bads.super__Vector_base<long,_std::allocator<long>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            reached_bads.super__Vector_base<long,_std::allocator<long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                    (&reached_bads,
                     (iterator)
                     reached_bads.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                     super__Vector_impl_data._M_finish,(long *)(local_70 + 1));
        }
        else {
          *reached_bads.super__Vector_base<long,_std::allocator<long>_>._M_impl.
           super__Vector_impl_data._M_finish = -1;
          reached_bads.super__Vector_base<long,_std::allocator<long>_>._M_impl.
          super__Vector_impl_data._M_finish =
               reached_bads.super__Vector_base<long,_std::allocator<long>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        num_unreached_bads = num_unreached_bads + 1;
        break;
      case BTOR2_TAG_constraint:
        msg(2,"constraint %ld at line %ld",
            (long)constraints.super__Vector_base<Btor2Line_*,_std::allocator<Btor2Line_*>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)constraints.super__Vector_base<Btor2Line_*,_std::allocator<Btor2Line_*>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3,pBVar7->lineno);
        if (constraints.super__Vector_base<Btor2Line_*,_std::allocator<Btor2Line_*>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            constraints.super__Vector_base<Btor2Line_*,_std::allocator<Btor2Line_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          this = &constraints;
          __position._M_current =
               constraints.super__Vector_base<Btor2Line_*,_std::allocator<Btor2Line_*>_>._M_impl.
               super__Vector_impl_data._M_finish;
LAB_0010f3e1:
          std::vector<Btor2Line*,std::allocator<Btor2Line*>>::_M_realloc_insert<Btor2Line*const&>
                    ((vector<Btor2Line*,std::allocator<Btor2Line*>> *)this,__position,&local_88);
        }
        else {
          *constraints.super__Vector_base<Btor2Line_*,_std::allocator<Btor2Line_*>_>._M_impl.
           super__Vector_impl_data._M_finish = local_88;
          constraints.super__Vector_base<Btor2Line_*,_std::allocator<Btor2Line_*>_>._M_impl.
          super__Vector_impl_data._M_finish =
               constraints.super__Vector_base<Btor2Line_*,_std::allocator<Btor2Line_*>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        break;
      default:
        pcVar12 = " ...";
        if (pBVar7->nargs == 0) {
          pcVar12 = "";
        }
        die("parse error in \'%s\' at line %ld: unsupported \'%ld %s%s\'",model_path,pBVar7->lineno,
            pBVar7->id,pBVar7->name,pcVar12);
        break;
      case BTOR2_TAG_init:
        iVar9 = *pBVar7->args;
        ppBVar10 = inits.super__Vector_base<Btor2Line_*,_std::allocator<Btor2Line_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
        goto LAB_0010f221;
      case BTOR2_TAG_input:
        lVar11 = (long)inputs.super__Vector_base<Btor2Line_*,_std::allocator<Btor2Line_*>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)inputs.super__Vector_base<Btor2Line_*,_std::allocator<Btor2Line_*>_>._M_impl.
                       super__Vector_impl_data._M_start >> 3;
        if (pBVar7->symbol == (char *)0x0) {
          msg(2,"input %ld at line %ld",lVar11,pBVar7->lineno);
        }
        else {
          msg(2,"input %ld \'%s\' at line %ld",lVar11);
        }
        if (inputs.super__Vector_base<Btor2Line_*,_std::allocator<Btor2Line_*>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            inputs.super__Vector_base<Btor2Line_*,_std::allocator<Btor2Line_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          this = &inputs;
          __position._M_current =
               inputs.super__Vector_base<Btor2Line_*,_std::allocator<Btor2Line_*>_>._M_impl.
               super__Vector_impl_data._M_finish;
          goto LAB_0010f3e1;
        }
        *inputs.super__Vector_base<Btor2Line_*,_std::allocator<Btor2Line_*>_>._M_impl.
         super__Vector_impl_data._M_finish = local_88;
        inputs.super__Vector_base<Btor2Line_*,_std::allocator<Btor2Line_*>_>._M_impl.
        super__Vector_impl_data._M_finish =
             inputs.super__Vector_base<Btor2Line_*,_std::allocator<Btor2Line_*>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
        break;
      case BTOR2_TAG_next:
        iVar9 = *pBVar7->args;
        ppBVar10 = nexts.super__Vector_base<Btor2Line_*,_std::allocator<Btor2Line_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
LAB_0010f221:
        ppBVar10[iVar9] = pBVar7;
        break;
      case BTOR2_TAG_sort:
        BVar1 = (pBVar7->sort).tag;
        if (BVar1 == BTOR2_TAG_SORT_array) {
          msg(2,"sort array %u %u at line %ld",(pBVar7->sort).field_3.array.index,
              (pBVar7->sort).field_3.array.element,pBVar7->lineno);
        }
        else if (BVar1 == BTOR2_TAG_SORT_bitvec) {
          msg(2,"sort bitvec %u at line %ld",(ulong)(pBVar7->sort).field_3.bitvec.width,
              pBVar7->lineno);
        }
        else {
          die("parse error in \'%s\' at line %ld: unsupported sort \'%s\'",model_path,pBVar7->lineno
              ,(pBVar7->sort).name);
        }
        break;
      case BTOR2_TAG_state:
        lVar11 = (long)states.super__Vector_base<Btor2Line_*,_std::allocator<Btor2Line_*>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)states.super__Vector_base<Btor2Line_*,_std::allocator<Btor2Line_*>_>._M_impl.
                       super__Vector_impl_data._M_start >> 3;
        if (pBVar7->symbol == (char *)0x0) {
          msg(2,"state %ld at line %ld",lVar11,pBVar7->lineno);
        }
        else {
          msg(2,"state %ld \'%s\' at line %ld",lVar11);
        }
        if (states.super__Vector_base<Btor2Line_*,_std::allocator<Btor2Line_*>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            states.super__Vector_base<Btor2Line_*,_std::allocator<Btor2Line_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          this = &states;
          __position._M_current =
               states.super__Vector_base<Btor2Line_*,_std::allocator<Btor2Line_*>_>._M_impl.
               super__Vector_impl_data._M_finish;
          goto LAB_0010f3e1;
        }
        *states.super__Vector_base<Btor2Line_*,_std::allocator<Btor2Line_*>_>._M_impl.
         super__Vector_impl_data._M_finish = local_88;
        states.super__Vector_base<Btor2Line_*,_std::allocator<Btor2Line_*>_>._M_impl.
        super__Vector_impl_data._M_finish =
             states.super__Vector_base<Btor2Line_*,_std::allocator<Btor2Line_*>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      pBVar7 = (Btor2Line *)btor2parser_iter_next(&local_60);
    } while (pBVar7 != (Btor2Line *)0x0);
  }
  if (states.super__Vector_base<Btor2Line_*,_std::allocator<Btor2Line_*>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      states.super__Vector_base<Btor2Line_*,_std::allocator<Btor2Line_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar16 = 0;
    do {
      if (nexts.super__Vector_base<Btor2Line_*,_std::allocator<Btor2Line_*>_>._M_impl.
          super__Vector_impl_data._M_start
          [states.super__Vector_base<Btor2Line_*,_std::allocator<Btor2Line_*>_>._M_impl.
           super__Vector_impl_data._M_start[uVar16]->id] == (Btor2Line *)0x0) {
        msg(1,"state %d without next function");
      }
      uVar16 = uVar16 + 1;
    } while (uVar16 < (ulong)((long)states.
                                    super__Vector_base<Btor2Line_*,_std::allocator<Btor2Line_*>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                              (long)states.
                                    super__Vector_base<Btor2Line_*,_std::allocator<Btor2Line_*>_>.
                                    _M_impl.super__Vector_impl_data._M_start >> 3));
  }
  uVar16 = local_70[0];
  if ((long)bads.super__Vector_base<Btor2Line_*,_std::allocator<Btor2Line_*>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)bads.super__Vector_base<Btor2Line_*,_std::allocator<Btor2Line_*>_>._M_impl.
            super__Vector_impl_data._M_start >> 3 <= (long)local_70[0]) {
    die("invalid faked bad state property number %ld",local_70[0]);
  }
  uVar13 = local_78;
  if ((long)justices.super__Vector_base<Btor2Line_*,_std::allocator<Btor2Line_*>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)justices.super__Vector_base<Btor2Line_*,_std::allocator<Btor2Line_*>_>._M_impl.
            super__Vector_impl_data._M_start >> 3 <= (long)local_78) {
    die("invalid faked justice property number %ld",local_78);
  }
  if (close_model_file == '\x01') {
    iVar15 = fclose((FILE *)model_file);
    if (iVar15 != 0) {
      die("can not close model file \'%s\'",model_path);
    }
  }
  setup_states();
  if (bVar19 && bVar18) {
    msg(1,"reading BTOR witness from \'%s\'",witness_path);
    _ZL8constant_0 = (void *)0x0;
    _ZL8constant_1 = 0;
    _ZL8constant_2 = 0;
    _ZL6symbol_0 = (void *)0x0;
    _ZL6symbol_1 = 0;
    _ZL6symbol_2 = 0;
    _ZL11array_index_0 = (void *)0x0;
    _ZL11array_index_1 = 0;
    _ZL11array_index_2 = 0;
    iVar15 = next_char();
    if (iVar15 != -1) {
      do {
        found_end_of_witness = 0;
        if (iVar15 == 0x73) {
          iVar15 = next_char();
          if (iVar15 == 0x61) {
            iVar15 = next_char();
            if (iVar15 == 0x74) {
              iVar15 = next_char();
              if (iVar15 == 10) {
                count_witnesses = count_witnesses + 1;
                count_sat_witnesses = count_sat_witnesses + 1;
                msg(1,"found witness %ld header \'sat\' in \'%s\' at line %ld",count_sat_witnesses,
                    witness_path,lineno + -1);
                if (1 < count_witnesses) {
                  die("more than one actual witness not supported yet");
                }
                msg(1,"parsing \'sat\' witness %ld",count_sat_witnesses);
                do {
                  do {
                    uVar4 = next_char();
                  } while (uVar4 == 0x20);
                  if (uVar4 == 10) break;
                  if ((uVar4 & 0xfffffff7) != 0x62) {
                    pcVar12 = "expected \'b\' or \'j\'";
                    goto LAB_0010fa43;
                  }
                  pBVar8 = (value_type)parse_unsigned_number((int32_t *)&local_88);
                  pBVar7 = local_88;
                  iVar15 = (int)local_88;
                  local_60._M_impl._0_8_ = pBVar8;
                  if (((int)local_88 != 10) && ((int)local_88 != 0x20)) {
                    iVar15 = isprint((int)local_88);
                    if (iVar15 == 0) {
                      pcVar12 = 
                      "unexpected character 0x%02x after number (expected space or new-line)";
                    }
                    else {
                      pcVar12 = "unexpected \'%c\' after number (expected space or new-line)";
                    }
                    parse_error(pcVar12,(ulong)pBVar7 & 0xffffffff);
                    operator_delete(&local_88);
                    _Unwind_Resume(extraout_RAX);
                  }
                  if (uVar4 != 0x62) {
LAB_0010fced:
                    pcVar12 = "can not handle justice properties yet";
                    goto LAB_0010fa43;
                  }
                  if ((long)bads.super__Vector_base<Btor2Line_*,_std::allocator<Btor2Line_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)bads.super__Vector_base<Btor2Line_*,_std::allocator<Btor2Line_*>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 3 <= (long)pBVar8) {
                    parse_error("invalid bad state property number %ld",pBVar8);
                    goto LAB_0010fced;
                  }
                  msg(3,"... claims to be witness of bad state property number \'b%ld\'",pBVar8);
                  if (claimed_bad_witnesses.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_finish ==
                      claimed_bad_witnesses.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage) {
                    std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
                              ((vector<long,std::allocator<long>> *)&claimed_bad_witnesses,
                               (iterator)
                               claimed_bad_witnesses.super__Vector_base<long,_std::allocator<long>_>
                               ._M_impl.super__Vector_impl_data._M_finish,(long *)&local_60);
                  }
                  else {
                    *claimed_bad_witnesses.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                     super__Vector_impl_data._M_finish = local_60._M_impl._0_8_;
                    claimed_bad_witnesses.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_finish =
                         claimed_bad_witnesses.super__Vector_base<long,_std::allocator<long>_>.
                         _M_impl.super__Vector_impl_data._M_finish + 1;
                  }
                } while (iVar15 != 10);
                lVar11 = -1;
                do {
                  lVar17 = lVar11;
                  lVar11 = lVar17 + 1;
                  iVar3 = parse_frame(lVar11);
                } while (iVar3 != 0);
                msg(1,"finished parsing k = %ld frames",lVar11);
                if (dump_vcd == '\x01') {
                  BtorSimVCDWriter::update_time(vcd_writer,lVar17 + 2);
                }
                report();
                if (print_trace == '\0') {
                  puts(".");
                  fflush(_stdout);
                }
                if (claimed_bad_witnesses.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_finish !=
                    claimed_bad_witnesses.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start) {
                  uVar16 = 0;
                  do {
                    lVar11 = claimed_bad_witnesses.super__Vector_base<long,_std::allocator<long>_>.
                             _M_impl.super__Vector_impl_data._M_start[uVar16];
                    if (reached_bads.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar11] < 0) {
                      die("claimed bad state property \'b%ld\' id %ld not reached",lVar11,
                          bads.super__Vector_base<Btor2Line_*,_std::allocator<Btor2Line_*>_>._M_impl
                          .super__Vector_impl_data._M_start[lVar11]->id);
                    }
                    uVar16 = uVar16 + 1;
                  } while (uVar16 < (ulong)((long)claimed_bad_witnesses.
                                                  super__Vector_base<long,_std::allocator<long>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish -
                                            (long)claimed_bad_witnesses.
                                                  super__Vector_base<long,_std::allocator<long>_>.
                                                  _M_impl.super__Vector_impl_data._M_start >> 3));
                }
                goto LAB_0010f745;
              }
            }
          }
LAB_0010f97d:
          if (iVar15 == 0x75) {
            iVar15 = next_char();
            if (iVar15 == 0x6e) {
              iVar15 = next_char();
              if (iVar15 == 0x73) {
                iVar15 = next_char();
                if (iVar15 == 0x61) {
                  iVar15 = next_char();
                  if (iVar15 == 0x74) {
                    iVar15 = next_char();
                    if (iVar15 == 10) {
                      count_witnesses = count_witnesses + 1;
                      count_unsat_witnesses = count_unsat_witnesses + 1;
                      msg(1,"found witness %ld header \'unsat\' in \'%s\' at line %ld",witness_path,
                          count_unsat_witnesses,lineno + -1);
                      msg(1,"parsing \'unsat\' witness %ld",count_unsat_witnesses);
                      die("\'unsat\' witnesses not supported yet");
                      goto LAB_0010f745;
                    }
                  }
                }
              }
            }
          }
          while (iVar15 != 10) {
            iVar15 = next_char();
            if (iVar15 == -1) {
              pcVar12 = "unexpected end-of-file before new-line";
LAB_0010fa43:
              parse_error(pcVar12);
              goto LAB_0010fa4a;
            }
          }
        }
        else {
          if (iVar15 != 0x23) goto LAB_0010f97d;
          count_witnesses = count_witnesses + 1;
          count_unknown_witnesses = count_unknown_witnesses + 1;
          if (1 < count_unknown_witnesses + count_sat_witnesses) {
            die("more than one actual witness not supported yet");
          }
          charno = charno + -1;
          columno = columno + -1;
          saved_char = 0x23;
          char_saved = 1;
          msg(1,"parsing unknown witness %ld",count_unknown_witnesses);
          lVar11 = -1;
          do {
            lVar11 = lVar11 + 1;
            iVar3 = parse_frame(lVar11);
          } while (iVar3 != 0);
          report();
          if (print_trace == '\0') {
            puts(".");
            fflush(_stdout);
          }
          msg(1,"finished parsing k = %ld frames",lVar11);
        }
LAB_0010f745:
        iVar15 = next_char();
      } while (iVar15 != -1);
    }
LAB_0010fa4a:
    free(_ZL8constant_0);
    _ZL8constant_0 = (void *)0x0;
    _ZL8constant_1 = 0;
    _ZL8constant_2 = 0;
    free(_ZL6symbol_0);
    _ZL6symbol_0 = (void *)0x0;
    _ZL6symbol_1 = 0;
    _ZL6symbol_2 = 0;
    free(_ZL11array_index_0);
    _ZL11array_index_0 = (void *)0x0;
    _ZL11array_index_1 = 0;
    _ZL11array_index_2 = 0;
    pcVar12 = "finished parsing %ld witnesses after reading %ld bytes (%.1f MB)";
    msg(1,"finished parsing %ld witnesses after reading %ld bytes (%.1f MB)",
        (double)charno * 9.5367431640625e-07,count_witnesses);
    if (close_witness_file == '\x01') {
      iVar15 = fclose((FILE *)witness_file);
      if (iVar15 != 0) {
        pcVar12 = witness_path;
        die("can not close witness file \'%s\'");
      }
    }
    goto LAB_0010fc02;
  }
  iVar15 = 0x14;
  if (-1 < local_90) {
    iVar15 = local_90;
  }
  local_90 = iVar15;
  uVar4 = local_8c;
  if ((int)local_8c < 1) {
    uVar4 = 0;
  }
  local_8c = uVar4;
  msg(1,"using random seed %d",(ulong)uVar4);
  btorsim_rng_init(&rng,uVar4);
  if (print_trace == '\0') {
    if ((long)(uVar13 | uVar16) < 0) {
      if ((long)uVar16 < 0) {
        if ((long)uVar13 < 0) goto LAB_0010fb3f;
        pcVar12 = "sat\nj%ld\n";
      }
      else {
        pcVar12 = "sat\nb%ld\n";
        uVar13 = uVar16;
      }
      printf(pcVar12,uVar13);
    }
    else {
      printf("sat\nb%ld j%ld\n",uVar16,uVar13);
    }
  }
LAB_0010fb3f:
  lVar11 = (long)local_90;
  msg(1,"starting random simulation up to bound %ld",lVar11);
  initialize_states(1);
  initialize_inputs(0,1);
  pcVar12 = (char *)0x1;
  simulate_step(0,1);
  if (((0 < lVar11) && (constraints_violated < 0)) && (num_unreached_bads != 0)) {
    lVar17 = 1;
    do {
      transition(lVar17);
      initialize_inputs(lVar17,1);
      pcVar12 = (char *)0x1;
      simulate_step(lVar17,1);
      if ((lVar11 <= lVar17) || (-1 < constraints_violated)) break;
      lVar17 = lVar17 + 1;
    } while (num_unreached_bads != 0);
  }
  if (print_trace == '\0') {
    puts(".");
    fflush(_stdout);
  }
  report();
LAB_0010fc02:
  if (dump_vcd == '\x01') {
    pcVar12 = (char *)model;
    BtorSimVCDWriter::write_vcd(vcd_writer,model);
    pBVar5 = vcd_writer;
    if (vcd_writer != (BtorSimVCDWriter *)0x0) {
      BtorSimVCDWriter::~BtorSimVCDWriter(vcd_writer);
      operator_delete(pBVar5);
    }
  }
  btor2parser_delete(model);
  if (0 < num_format_lines) {
    lVar11 = 0;
    lVar17 = 0;
    do {
      if (*(int *)((long)&(current_state.
                           super__Vector_base<BtorSimState,_std::allocator<BtorSimState>_>._M_impl.
                           super__Vector_impl_data._M_start)->type + lVar11) != 0) {
        BtorSimState::remove
                  ((BtorSimState *)
                   ((long)&(current_state.
                            super__Vector_base<BtorSimState,_std::allocator<BtorSimState>_>._M_impl.
                            super__Vector_impl_data._M_start)->type + lVar11),pcVar12);
      }
      lVar17 = lVar17 + 1;
      lVar11 = lVar11 + 0x10;
    } while (lVar17 < num_format_lines);
  }
  if (0 < num_format_lines) {
    lVar11 = 0;
    lVar17 = 0;
    do {
      if (*(int *)((long)&(next_state.
                           super__Vector_base<BtorSimState,_std::allocator<BtorSimState>_>._M_impl.
                           super__Vector_impl_data._M_start)->type + lVar11) != 0) {
        BtorSimState::remove
                  ((BtorSimState *)
                   ((long)&(next_state.
                            super__Vector_base<BtorSimState,_std::allocator<BtorSimState>_>._M_impl.
                            super__Vector_impl_data._M_start)->type + lVar11),pcVar12);
      }
      lVar17 = lVar17 + 1;
      lVar11 = lVar11 + 0x10;
    } while (lVar17 < num_format_lines);
  }
  return 0;
}

Assistant:

int32_t
main (int32_t argc, char const *argv[])
{
  const char *info_path = nullptr;
  int64_t fake_bad = -1, fake_justice = -1;
  int32_t r = -1, s = -1;
  for (int32_t i = 1; i < argc; i++)
  {
    if (!strcmp (argv[i], "-h"))
      fputs (usage, stdout), exit (0);
    else if (!strcmp (argv[i], "-c"))
      print_trace = false;
    else if (!strcmp (argv[i], "-v"))
      verbosity++;
    else if (!strcmp (argv[i], "-r"))
    {
      if (++i == argc) die ("argument to '-r' missing");
      if (!parse_int (argv[i], &r)) die ("invalid number in '-r %s'", argv[i]);
    }
    else if (!strcmp (argv[i], "-s"))
    {
      if (++i == argc) die ("argument to '-s' missing");
      if (!parse_int (argv[i], &s)) die ("invalid number in '-s %s'", argv[i]);
    }
    else if (!strcmp (argv[i], "-b"))
    {
      if (++i == argc) die ("argument to '-b' missing");
      if (!parse_long (argv[i], &fake_bad))
        die ("invalid number in '-b %s'", argv[i]);
    }
    else if (!strcmp (argv[i], "-j"))
    {
      if (++i == argc) die ("argument to '-j' missing");
      if (!parse_long (argv[i], &fake_justice))
        die ("invalid number in '-j %s'", argv[i]);
    }
    else if (!strcmp (argv[i], "--states"))
      print_states = true;
    else if (!strcmp (argv[i], "--vcd"))
    {
      dump_vcd = true;
      if (++i == argc) die ("argument to '--vcd' missing");
      vcd_path = argv[i];
    }
    else if (!strcmp (argv[i], "--hierarchical-symbols"))
      symbol_fmt = true;
    else if (!strcmp (argv[i], "--info"))
    {
      if (++i == argc) die ("argument to '--info' missing");
      info_path = argv[i];
    }
    else if (argv[i][0] == '-')
      die ("invalid command line option '%s' (try '-h')", argv[i]);
    else if (witness_path)
      die ("too many file arguments '%s', '%s', and '%s'",
           model_path,
           witness_path,
           argv[i]);
    else if (model_path)
      witness_path = argv[i];
    else
      model_path = argv[i];
  }
  if (model_path)
  {
    if (!(model_file = fopen (model_path, "r")))
      die ("failed to open BTOR model file '%s' for reading", model_path);
    close_model_file = 1;
  }
  else
  {
    model_path = "<stdin>";
    model_file = stdin;
  }
  if (witness_path)
  {
    if (!(witness_file = fopen (witness_path, "r")))
      die ("failed to open witness file '%s' for reading", witness_path);
    close_witness_file = 1;
  }
  if (model_path && witness_path)
  {
    msg (1, "checking mode: both model and witness specified");
    checking_mode = 1;
    random_mode   = 0;
  }
  else
  {
    msg (1, "random mode: witness not specified");
    checking_mode = 0;
    random_mode   = 1;
  }
  if (checking_mode)
  {
    if (r >= 0)
      die ("number of random test vectors specified in checking mode");
    if (s >= 0) die ("random seed specified in checking mode");
    if (fake_bad >= 0) die ("can not fake bad state property in checking mode");
    if (fake_justice >= 0)
      die ("can not fake justice property in checking mode");
  }
  if (dump_vcd)
  {
    vcd_writer = new BtorSimVCDWriter (vcd_path, readable_vcd, symbol_fmt);
    if (info_path)
    {
      extra_constraints = vcd_writer->read_info_file (info_path);
    }
  }
  assert (model_path);
  msg (1, "reading BTOR model from '%s'", model_path);
  parse_model ();
  if (fake_bad >= (int64_t) bads.size ())
    die ("invalid faked bad state property number %" PRId64, fake_bad);
  if (fake_justice >= (int64_t) justices.size ())
    die ("invalid faked justice property number %" PRId64, fake_justice);
  if (close_model_file && fclose (model_file))
    die ("can not close model file '%s'", model_path);
  setup_states ();
  if (random_mode)
  {
    if (r < 0) r = 20;
    if (s < 0) s = 0;
    msg (1, "using random seed %d", s);
    btorsim_rng_init (&rng, (uint32_t) s);
    if (print_trace)
    {
      if (fake_bad >= 0 && fake_justice >= 0)
        printf ("sat\nb%" PRId64 " j%" PRId64 "\n", fake_bad, fake_justice);
      else if (fake_bad >= 0)
        printf ("sat\nb%" PRId64 "\n", fake_bad);
      else if (fake_justice >= 0)
        printf ("sat\nj%" PRId64 "\n", fake_justice);
    }
    random_simulation (r);
  }
  else
  {
    assert (witness_path);
    msg (1, "reading BTOR witness from '%s'", witness_path);
    parse_and_check_all_witnesses ();
    if (close_witness_file && fclose (witness_file))
      die ("can not close witness file '%s'", witness_path);
  }
  if (dump_vcd)
  {
    vcd_writer->write_vcd (model);
    delete vcd_writer;
  }
  btor2parser_delete (model);
  for (int64_t i = 0; i < num_format_lines; i++)
    if (current_state[i].type) current_state[i].remove ();
  for (int64_t i = 0; i < num_format_lines; i++)
    if (next_state[i].type) next_state[i].remove ();
  return 0;
}